

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_error.hpp
# Opt level: O3

char * __thiscall jsoncons::conv_error::what(conv_error *this)

{
  string *psVar1;
  undefined1 *puVar2;
  bool bVar3;
  char cVar4;
  undefined1 *puVar5;
  char cVar6;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  psVar1 = &this->what_;
  if ((this->what_)._M_string_length == 0) {
    std::runtime_error::what();
    std::__cxx11::string::append((char *)psVar1);
    if (this->line_number_ == 0) {
      if (this->column_number_ == 0) goto LAB_00239940;
      std::__cxx11::string::append((char *)psVar1);
      puVar2 = (undefined1 *)this->column_number_;
      cVar6 = '\x01';
      if ((undefined1 *)0x9 < puVar2) {
        puVar5 = puVar2;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (puVar5 < (undefined1 *)0x64) {
            cVar6 = cVar6 + -2;
            goto LAB_00239b73;
          }
          if (puVar5 < (undefined1 *)0x3e8) {
            cVar6 = cVar6 + -1;
            goto LAB_00239b73;
          }
          if (puVar5 < &DAT_00002710) goto LAB_00239b73;
          bVar3 = (undefined1 *)0x1869f < puVar5;
          puVar5 = (undefined1 *)((ulong)puVar5 / 10000);
          cVar4 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_00239b73:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_40,local_38,(unsigned_long)puVar2);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40);
    }
    else {
      if (this->column_number_ == 0) goto LAB_00239940;
      std::__cxx11::string::append((char *)psVar1);
      puVar2 = (undefined1 *)this->line_number_;
      cVar6 = '\x01';
      if ((undefined1 *)0x9 < puVar2) {
        puVar5 = puVar2;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (puVar5 < (undefined1 *)0x64) {
            cVar6 = cVar6 + -2;
            goto LAB_00239a77;
          }
          if (puVar5 < (undefined1 *)0x3e8) {
            cVar6 = cVar6 + -1;
            goto LAB_00239a77;
          }
          if (puVar5 < &DAT_00002710) goto LAB_00239a77;
          bVar3 = (undefined1 *)0x1869f < puVar5;
          puVar5 = (undefined1 *)((ulong)puVar5 / 10000);
          cVar4 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_00239a77:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_40,local_38,(unsigned_long)puVar2);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40);
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      std::__cxx11::string::append((char *)psVar1);
      puVar2 = (undefined1 *)this->column_number_;
      cVar6 = '\x01';
      if ((undefined1 *)0x9 < puVar2) {
        puVar5 = puVar2;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (puVar5 < (undefined1 *)0x64) {
            cVar6 = cVar6 + -2;
            goto LAB_00239b36;
          }
          if (puVar5 < (undefined1 *)0x3e8) {
            cVar6 = cVar6 + -1;
            goto LAB_00239b36;
          }
          if (puVar5 < &DAT_00002710) goto LAB_00239b36;
          bVar3 = (undefined1 *)0x1869f < puVar5;
          puVar5 = (undefined1 *)((ulong)puVar5 / 10000);
          cVar4 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_00239b36:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_40,local_38,(unsigned_long)puVar2);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
LAB_00239940:
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::system_error::what());
                    if (line_number_ != 0 && column_number_ != 0)
                    {
                        what_.append(" at line ");
                        what_.append(std::to_string(line_number_));
                        what_.append(" and column ");
                        what_.append(std::to_string(column_number_));
                    }
                    else if (column_number_ != 0)
                    {
                        what_.append(" at position ");
                        what_.append(std::to_string(column_number_));
                    }
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::system_error::what();
                }
            }